

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_bonsai_nlm.hpp
# Opt level: O0

pair<const_int_*,_unsigned_long> __thiscall
poplar::compact_bonsai_nlm<int,_16UL>::compare
          (compact_bonsai_nlm<int,_16UL> *this,uint64_t pos,char_range *key)

{
  bool bVar1;
  uint8_t uVar2;
  uint64_t uVar3;
  char_range *in_RDX;
  vector<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
  *in_RDI;
  uint64_t i_1;
  uint64_t length;
  uint64_t i;
  uint64_t alloc;
  uint64_t offset;
  uint8_t *ptr;
  type *pos_in_chunk;
  type *chunk_id;
  uint64_t in_stack_ffffffffffffff48;
  unsigned_long local_a8;
  int *local_a0;
  void *local_98;
  void *local_90;
  unsigned_long local_88;
  ulong local_80;
  int local_74;
  int *local_70;
  ulong local_68;
  uint64_t local_60;
  ulong local_58;
  int *local_50;
  type *local_48;
  size_type *local_40;
  pair<unsigned_long,_unsigned_long> local_38;
  char_range *local_28;
  pair<const_int_*,_unsigned_long> local_10;
  
  local_28 = in_RDX;
  local_38 = decompose_value<16ul>((uint64_t)in_RDI);
  local_40 = std::get<0ul,unsigned_long,unsigned_long>
                       ((pair<unsigned_long,_unsigned_long> *)0x13af36);
  local_48 = std::get<1ul,unsigned_long,unsigned_long>
                       ((pair<unsigned_long,_unsigned_long> *)0x13af48);
  std::
  vector<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
  ::operator[](in_RDI,*local_40);
  local_50 = (int *)std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                              ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *
                               )in_RDI);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)(in_RDI + 1),*local_40);
  local_58 = bit_tools::popcnt((uint16_t)((ulong)in_RDI >> 0x30),in_stack_ffffffffffffff48);
  local_60 = 0;
  for (local_68 = 0; local_68 < local_58; local_68 = local_68 + 1) {
    uVar3 = vbyte::decode((uint8_t *)local_50,&local_60);
    local_50 = (int *)((long)local_50 + local_60 + uVar3);
  }
  uVar3 = vbyte::decode((uint8_t *)local_50,&local_60);
  local_50 = (int *)((long)local_50 + uVar3);
  bVar1 = char_range::empty(local_28);
  if (bVar1) {
    local_70 = local_50;
    local_74 = 0;
    std::pair<const_int_*,_unsigned_long>::pair<const_int_*,_int,_true>
              (&local_10,&local_70,&local_74);
  }
  else {
    local_80 = local_60 - 4;
    for (local_88 = 0; local_88 < local_80; local_88 = local_88 + 1) {
      uVar2 = char_range::operator[](local_28,local_88);
      if (uVar2 != *(uint8_t *)((long)local_50 + local_88)) {
        local_90 = (void *)0x0;
        std::pair<const_int_*,_unsigned_long>::pair<std::nullptr_t,_unsigned_long_&,_true>
                  (&local_10,&local_90,&local_88);
        return local_10;
      }
    }
    uVar2 = char_range::operator[](local_28,local_80);
    if (uVar2 == '\0') {
      local_a0 = (int *)((long)local_50 + local_80);
      local_a8 = local_80 + 1;
      std::pair<const_int_*,_unsigned_long>::pair<const_int_*,_unsigned_long,_true>
                (&local_10,&local_a0,&local_a8);
    }
    else {
      local_98 = (void *)0x0;
      std::pair<const_int_*,_unsigned_long>::pair<std::nullptr_t,_unsigned_long_&,_true>
                (&local_10,&local_98,&local_80);
    }
  }
  return local_10;
}

Assistant:

std::pair<const value_type*, uint64_t> compare(uint64_t pos, const char_range& key) const {
        auto [chunk_id, pos_in_chunk] = decompose_value<ChunkSize>(pos);

        assert(ptrs_[chunk_id]);
        assert(bit_tools::get_bit(chunks_[chunk_id], pos_in_chunk));

        const uint8_t* ptr = ptrs_[chunk_id].get();
        const uint64_t offset = bit_tools::popcnt(chunks_[chunk_id], pos_in_chunk);

        uint64_t alloc = 0;
        for (uint64_t i = 0; i < offset; ++i) {
            ptr += vbyte::decode(ptr, alloc);
            ptr += alloc;
        }
        ptr += vbyte::decode(ptr, alloc);

        if (key.empty()) {
            return {reinterpret_cast<const value_type*>(ptr), 0};
        }

        uint64_t length = alloc - sizeof(value_type);
        for (uint64_t i = 0; i < length; ++i) {
            if (key[i] != ptr[i]) {
                return {nullptr, i};
            }
        }

        if (key[length] != '\0') {
            return {nullptr, length};
        }

        // +1 considers the terminator '\0'
        return {reinterpret_cast<const value_type*>(ptr + length), length + 1};
    }